

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimUnrequiredCapabilities
          (TrimCapabilitiesPass *this,CapabilitySet *required_capabilities)

{
  bool bVar1;
  Capability capability_00;
  Status SVar2;
  IRContext *pIVar3;
  CapabilitySet *this_00;
  size_t sVar4;
  undefined1 local_d8 [4];
  Capability capability_1;
  iterator __end2_1;
  iterator __begin2_1;
  CapabilitySet *__range2_1;
  Capability local_7c;
  undefined1 local_78 [4];
  Capability capability;
  iterator __end2;
  iterator __begin2;
  CapabilitySet *__range2;
  CapabilitySet capabilities_to_trim;
  FeatureManager *feature_manager;
  CapabilitySet *required_capabilities_local;
  TrimCapabilitiesPass *this_local;
  
  pIVar3 = Pass::context(&this->super_Pass);
  capabilities_to_trim.size_ = (size_t)IRContext::get_feature_mgr(pIVar3);
  EnumSet<spv::Capability>::EnumSet((EnumSet<spv::Capability> *)&__range2);
  this_00 = FeatureManager::GetCapabilities((FeatureManager *)capabilities_to_trim.size_);
  EnumSet<spv::Capability>::begin((iterator *)&__end2.bucketOffset_,this_00);
  EnumSet<spv::Capability>::end((iterator *)local_78,this_00);
  while (bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                           ((Iterator *)&__end2.bucketOffset_,(Iterator *)local_78), bVar1) {
    local_7c = EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end2.bucketOffset_);
    bVar1 = EnumSet<spv::Capability>::contains(&this->untouchableCapabilities_,local_7c);
    if (((!bVar1) &&
        (bVar1 = EnumSet<spv::Capability>::contains(&this->supportedCapabilities_,local_7c), bVar1))
       && (bVar1 = EnumSet<spv::Capability>::contains(required_capabilities,local_7c), !bVar1)) {
      EnumSet<spv::Capability>::insert
                ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&__range2_1,
                 (EnumSet<spv::Capability> *)&__range2,&local_7c);
    }
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end2.bucketOffset_);
  }
  EnumSet<spv::Capability>::begin
            ((iterator *)&__end2_1.bucketOffset_,(EnumSet<spv::Capability> *)&__range2);
  EnumSet<spv::Capability>::end((iterator *)local_d8,(EnumSet<spv::Capability> *)&__range2);
  while (bVar1 = EnumSet<spv::Capability>::Iterator::operator!=
                           ((Iterator *)&__end2_1.bucketOffset_,(Iterator *)local_d8), bVar1) {
    capability_00 =
         EnumSet<spv::Capability>::Iterator::operator*((Iterator *)&__end2_1.bucketOffset_);
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::RemoveCapability(pIVar3,capability_00);
    EnumSet<spv::Capability>::Iterator::operator++((Iterator *)&__end2_1.bucketOffset_);
  }
  sVar4 = EnumSet<spv::Capability>::size((EnumSet<spv::Capability> *)&__range2);
  SVar2 = SuccessWithChange;
  if (sVar4 == 0) {
    SVar2 = SuccessWithoutChange;
  }
  EnumSet<spv::Capability>::~EnumSet((EnumSet<spv::Capability> *)&__range2);
  return SVar2;
}

Assistant:

Pass::Status TrimCapabilitiesPass::TrimUnrequiredCapabilities(
    const CapabilitySet& required_capabilities) const {
  const FeatureManager* feature_manager = context()->get_feature_mgr();
  CapabilitySet capabilities_to_trim;
  for (auto capability : feature_manager->GetCapabilities()) {
    // Some capabilities cannot be safely removed. Leaving them untouched.
    if (untouchableCapabilities_.contains(capability)) {
      continue;
    }

    // If the capability is unsupported, don't trim it.
    if (!supportedCapabilities_.contains(capability)) {
      continue;
    }

    if (required_capabilities.contains(capability)) {
      continue;
    }

    capabilities_to_trim.insert(capability);
  }

  for (auto capability : capabilities_to_trim) {
    context()->RemoveCapability(capability);
  }

  return capabilities_to_trim.size() == 0 ? Pass::Status::SuccessWithoutChange
                                          : Pass::Status::SuccessWithChange;
}